

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

void __thiscall
soul::AST::ProcessorBase::ProcessorBase
          (ProcessorBase *this,ObjectType ot,CodeLocation *processorKeyword,Context *processorName,
          Identifier moduleName)

{
  int iVar1;
  undefined4 extraout_var;
  CodeLocation local_40;
  Context *local_30;
  Context *processorName_local;
  CodeLocation *processorKeyword_local;
  ProcessorBase *pPStack_18;
  ObjectType ot_local;
  ProcessorBase *this_local;
  Identifier moduleName_local;
  
  local_30 = processorName;
  processorName_local = (Context *)processorKeyword;
  processorKeyword_local._4_4_ = ot;
  pPStack_18 = this;
  this_local = (ProcessorBase *)moduleName.name;
  CodeLocation::CodeLocation(&local_40,processorKeyword);
  ModuleBase::ModuleBase(&this->super_ModuleBase,ot,&local_40,local_30,(Identifier)this_local);
  CodeLocation::~CodeLocation(&local_40);
  (this->super_ModuleBase).super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__ProcessorBase_00586690;
  (this->super_ModuleBase).super_Scope._vptr_Scope = (_func_int **)&PTR__ProcessorBase_00586748;
  std::
  vector<soul::pool_ref<soul::AST::EndpointDeclaration>,_std::allocator<soul::pool_ref<soul::AST::EndpointDeclaration>_>_>
  ::vector(&this->endpoints);
  Annotation::Annotation(&this->annotation);
  pool_ptr<soul::AST::ProcessorInstance>::pool_ptr(&this->owningInstance);
  pool_ptr<soul::AST::ProcessorBase>::pool_ptr(&this->originalBeforeSpecialisation);
  iVar1 = (*(this->super_ModuleBase).super_ASTObject._vptr_ASTObject[2])();
  checkAssertion(CONCAT44(extraout_var,iVar1) != 0,"getParentScope() != nullptr","ProcessorBase",
                 0x2cd);
  return;
}

Assistant:

ProcessorBase (ObjectType ot, CodeLocation processorKeyword, const Context& processorName, Identifier moduleName)
            : ModuleBase (ot, processorKeyword, processorName, moduleName)
        {
            SOUL_ASSERT (getParentScope() != nullptr);
        }